

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
ear::real_quadratic_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double a,double b,
          double c)

{
  size_type sVar1;
  double dVar2;
  ulong in_XMM1_Qb;
  double __x;
  double dVar3;
  initializer_list<double> __l;
  allocator_type local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_40;
  double local_38;
  double local_28;
  double local_18;
  ulong uStack_10;
  
  if (1e-10 <= ABS(c)) {
    if (ABS(a) < 1e-10) {
      local_68 = -c / b;
    }
    else {
      __x = b * b + a * -4.0 * c;
      if (1e-10 < __x) {
        local_18 = -b;
        uStack_10 = in_XMM1_Qb ^ 0x8000000000000000;
        dVar3 = SQRT(__x);
        dVar2 = dVar3;
        if (__x < 0.0) {
          local_58 = a;
          local_40 = dVar3;
          local_38 = __x;
          local_28 = b;
          dVar3 = sqrt(__x);
          b = local_28;
          __x = local_38;
          a = local_58;
          dVar2 = local_40;
        }
        local_60 = a + a;
        local_68 = (dVar3 - b) / local_60;
        if (__x < 0.0) {
          local_58 = local_60;
          dVar2 = sqrt(__x);
          local_60 = local_58;
        }
        local_60 = (local_18 - dVar2) / local_60;
        sVar1 = 2;
        goto LAB_0013fec9;
      }
      if (__x <= -1e-10) {
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      local_68 = -b / (a + a);
    }
  }
  else {
    local_68 = 0.0;
  }
  sVar1 = 1;
LAB_0013fec9:
  __l._M_array = &local_68;
  __l._M_len = sVar1;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> real_quadratic_roots(double a, double b, double c) {
    double eps = 1e-10;

    if (std::abs(c) < eps) return {0.0};
    if (std::abs(a) < eps) return {-c / b};

    double det = b * b - 4.0 * a * c;
    if (det > eps)
      return {(-b + sqrt(det)) / (2.0 * a), (-b - sqrt(det)) / (2.0 * a)};
    else if (det > -eps)
      return {-b / (2.0 * a)};
    else
      return {};
  }